

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O3

void __thiscall vigra::BmpDecoderImpl::read_4bit_data(BmpDecoderImpl *this)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint i;
  _Ios_Seekdir _Var7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  
  uVar1 = (this->grayscale ^ 1) * 2 + 1;
  uVar11 = (this->info_header).width * uVar1;
  uVar8 = (ulong)((this->info_header).height * uVar11);
  iVar5 = 0;
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::reserve(&(this->pixels).super_void_vector_base,uVar8);
  (this->pixels).super_void_vector_base.m_size = (this->pixels).super_void_vector_base.m_capacity;
  iVar4 = (this->info_header).width;
  iVar10 = (this->info_header).height;
  iVar4 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) % 4;
  _Var7 = 4 - iVar4;
  if (iVar4 == 0) {
    _Var7 = _S_beg;
  }
  if (0 < iVar10) {
    lVar6 = uVar8 + (long)(this->pixels).super_void_vector_base.m_data;
    do {
      lVar6 = lVar6 - (ulong)uVar11;
      if (0 < (this->info_header).width) {
        uVar9 = 0;
        lVar12 = lVar6;
        do {
          if ((uVar9 & 1) == 0) {
            iVar5 = std::istream::get();
          }
          pvVar2 = (this->map).super_void_vector_base.m_data;
          uVar8 = 0;
          do {
            *(undefined1 *)(lVar12 + uVar8) =
                 *(undefined1 *)
                  ((long)pvVar2 + uVar8 + (ulong)(iVar5 >> ((byte)uVar9 & 1 ^ 1) & 0xf) * 3);
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
          lVar12 = lVar12 + (ulong)uVar1;
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < (this->info_header).width);
      }
      std::istream::seekg((long)this,_Var7);
      bVar3 = 1 < iVar10;
      iVar10 = iVar10 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_4bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;
    int c = 0;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = ( ( info_header.width + 1 ) / 2 ) % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // eventually get a new byte from the stream
            if ( x % 2 == 0 )
                c = stream.get();

            // get the color index
            const UInt8 index = ( c >> ( 1 - ( x % 2 ) ) ) & 0x0f;

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}